

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

Path * Pathie::Path::global_cache_dir(Path *__return_storage_ptr__,localpathtype local)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_58;
  string local_38;
  
  if ((local == LOCALPATH_LOCAL) ||
     ((local == LOCALPATH_DEFAULT && (c_localdefault == LOCALPATH_LOCAL)))) {
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/var/local/cache","");
    Path(__return_storage_ptr__,&local_38);
    _Var1._M_p = local_38._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/var/cache","");
    Path(__return_storage_ptr__,&local_58);
    _Var1._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_cache_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
 if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/cache");
  else
    return Path("/var/cache");
#elif defined(_WIN32)
  return global_mutable_data_dir();
#else
#error Unsupported system.
#endif
}